

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ImGuiStoragePair *pIVar4;
  ImGuiStoragePair *p;
  int n;
  char *label_local;
  ImGuiStorage *storage_local;
  
  uVar1 = (storage->Data).Size;
  uVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::size_in_bytes(&storage->Data);
  bVar2 = TreeNode(label,"%s: %d entries, %d bytes",label,(ulong)uVar1,(ulong)uVar3);
  if (bVar2) {
    for (p._4_4_ = 0; p._4_4_ < (storage->Data).Size; p._4_4_ = p._4_4_ + 1) {
      pIVar4 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&storage->Data,p._4_4_);
      BulletText("Key 0x%08X Value { i: %d }",(ulong)pIVar4->key,
                 (ulong)(uint)(pIVar4->field_1).val_i);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeStorage(ImGuiStorage* storage, const char* label)
{
    if (!TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
        return;
    for (int n = 0; n < storage->Data.Size; n++)
    {
        const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
        BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
    }
    TreePop();
}